

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

string * __thiscall
Assimp::Ogre::VertexElement::SemanticToString_abi_cxx11_
          (string *__return_storage_ptr__,VertexElement *this,Semantic semantic)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((int)this) {
  case 1:
    __s = "POSITION";
    __a = &local_9;
    break;
  case 2:
    __s = "BLEND_WEIGHTS";
    __a = &local_a;
    break;
  case 3:
    __s = "BLEND_INDICES";
    __a = &local_b;
    break;
  case 4:
    __s = "NORMAL";
    __a = &local_c;
    break;
  case 5:
    __s = "DIFFUSE";
    __a = &local_d;
    break;
  case 6:
    __s = "SPECULAR";
    __a = &local_e;
    break;
  case 7:
    __s = "TEXTURE_COORDINATES";
    __a = &local_f;
    break;
  case 8:
    __s = "BINORMAL";
    __a = &local_10;
    break;
  case 9:
    __s = "TANGENT";
    __a = &local_11;
    break;
  default:
    __s = "Uknown_VertexElement::Semantic";
    __a = &local_12;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string VertexElement::SemanticToString(Semantic semantic)
{
    switch(semantic)
    {
        case VES_POSITION:              return "POSITION";
        case VES_BLEND_WEIGHTS:         return "BLEND_WEIGHTS";
        case VES_BLEND_INDICES:         return "BLEND_INDICES";
        case VES_NORMAL:                return "NORMAL";
        case VES_DIFFUSE:               return "DIFFUSE";
        case VES_SPECULAR:              return "SPECULAR";
        case VES_TEXTURE_COORDINATES:   return "TEXTURE_COORDINATES";
        case VES_BINORMAL:              return "BINORMAL";
        case VES_TANGENT:               return "TANGENT";
    }
    return "Uknown_VertexElement::Semantic";
}